

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

int __thiscall zmq::udp_engine_t::add_membership(udp_engine_t *this,fd_t s_,udp_address_t *addr_)

{
  int iVar1;
  ip_addr_t *this_00;
  udp_address_t *in_RDX;
  int in_ESI;
  int iface;
  ipv6_mreq mreq_1;
  ip_mreq mreq;
  int rc;
  ip_addr_t *mcast_addr;
  undefined8 local_40;
  undefined8 local_38;
  int in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  int local_24;
  
  this_00 = udp_address_t::target_addr(in_RDX);
  local_24 = 0;
  iVar1 = ip_addr_t::family((ip_addr_t *)&this_00->generic);
  if (iVar1 == 2) {
    in_stack_ffffffffffffffd4 = (this_00->ipv6).sin6_flowinfo;
    udp_address_t::bind_addr(in_RDX);
    local_24 = setsockopt(in_ESI,0,0x23,&stack0xffffffffffffffd4,8);
  }
  else {
    iVar1 = ip_addr_t::family((ip_addr_t *)&this_00->generic);
    if (iVar1 == 10) {
      in_stack_ffffffffffffffd0 = udp_address_t::bind_if(in_RDX);
      if (in_stack_ffffffffffffffd0 < -1) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","iface >= -1",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/udp_engine.cpp"
                ,0x14b);
        fflush(_stderr);
        zmq_abort((char *)0x30f411);
      }
      local_40 = *(undefined8 *)((this_00->generic).sa_data + 6);
      local_38 = *(undefined8 *)((long)&(this_00->ipv6).sin6_addr.__in6_u + 8);
      local_24 = setsockopt(in_ESI,0x29,0x14,&local_40,0x14);
    }
  }
  assert_success_or_recoverable(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return local_24;
}

Assistant:

int zmq::udp_engine_t::add_membership (fd_t s_, const udp_address_t *addr_)
{
    const ip_addr_t *mcast_addr = addr_->target_addr ();
    int rc = 0;

    if (mcast_addr->family () == AF_INET) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr = mcast_addr->ipv4.sin_addr;
        mreq.imr_interface = addr_->bind_addr ()->ipv4.sin_addr;

        rc = setsockopt (s_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));

    } else if (mcast_addr->family () == AF_INET6) {
        struct ipv6_mreq mreq;
        const int iface = addr_->bind_if ();

        zmq_assert (iface >= -1);

        mreq.ipv6mr_multiaddr = mcast_addr->ipv6.sin6_addr;
        mreq.ipv6mr_interface = iface;

        rc = setsockopt (s_, IPPROTO_IPV6, IPV6_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));
    }

    assert_success_or_recoverable (s_, rc);
    return rc;
}